

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OrderedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedStructurePatternMemberSyntax,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,PatternSyntax *args)

{
  OrderedStructurePatternMemberSyntax *pOVar1;
  
  pOVar1 = (OrderedStructurePatternMemberSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OrderedStructurePatternMemberSyntax *)this->endPtr < pOVar1 + 1) {
    pOVar1 = (OrderedStructurePatternMemberSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pOVar1 + 1);
  }
  (pOVar1->super_StructurePatternMemberSyntax).super_SyntaxNode.kind = OrderedStructurePatternMember
  ;
  (pOVar1->super_StructurePatternMemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pOVar1->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pOVar1->pattern).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pOVar1;
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }